

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

bool picojson::
     _parse_codepoint<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  pbVar4 = (byte *)(in->cur_)._M_current;
  pbVar3 = (byte *)(in->end_)._M_current;
  bVar9 = in->consumed_;
  iVar5 = in->line_;
  uVar12 = 0;
  iVar7 = 4;
  do {
    if ((bVar9 & 1) != 0) {
      if (*pbVar4 == 10) {
        iVar5 = iVar5 + 1;
        in->line_ = iVar5;
      }
      pbVar4 = pbVar4 + 1;
      (in->cur_)._M_current = (char *)pbVar4;
    }
    if (pbVar4 == pbVar3) goto LAB_00108a93;
    in->consumed_ = true;
    bVar2 = *pbVar4;
    uVar10 = bVar2 - 0x30;
    if (9 < uVar10) {
      if (bVar2 - 0x41 < 6) {
        uVar10 = bVar2 - 0x37;
      }
      else {
        if (5 < bVar2 - 0x61) goto LAB_00108a93;
        uVar10 = bVar2 - 0x57;
      }
    }
    uVar12 = uVar12 * 0x10 + uVar10;
    bVar9 = 1;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  if (uVar12 != 0xffffffff) {
    if ((uVar12 & 0xfffff800) != 0xd800) {
LAB_00108ac3:
      cVar6 = (char)out;
      if (0x7f < (int)uVar12) {
        if (0x7ff < uVar12) {
          if (0xffff < uVar12) {
            std::__cxx11::string::push_back(cVar6);
          }
          std::__cxx11::string::push_back(cVar6);
        }
        std::__cxx11::string::push_back(cVar6);
      }
      std::__cxx11::string::push_back(cVar6);
      return true;
    }
    if (uVar12 < 0xdc00) {
      if (bVar2 == 10) {
        iVar5 = iVar5 + 1;
        in->line_ = iVar5;
      }
      pbVar1 = pbVar4 + 1;
      (in->cur_)._M_current = (char *)pbVar1;
      if ((pbVar1 != pbVar3) && (in->consumed_ = true, *pbVar1 == 0x5c)) {
        if (*pbVar1 == 10) {
          iVar5 = iVar5 + 1;
          in->line_ = iVar5;
        }
        pbVar1 = pbVar4 + 2;
        (in->cur_)._M_current = (char *)pbVar1;
        if ((pbVar1 != pbVar3) && (in->consumed_ = true, *pbVar1 == 0x75)) {
          lVar8 = 0;
          bVar9 = 0x75;
          uVar10 = 0;
          while( true ) {
            if (bVar9 == 10) {
              iVar5 = iVar5 + 1;
              in->line_ = iVar5;
            }
            pbVar1 = pbVar4 + lVar8 + 3;
            (in->cur_)._M_current = (char *)pbVar1;
            if (pbVar1 == pbVar3) goto LAB_00108a93;
            in->consumed_ = true;
            bVar9 = *pbVar1;
            uVar11 = bVar9 - 0x30;
            if (9 < uVar11) {
              if (bVar9 - 0x41 < 6) {
                uVar11 = bVar9 - 0x37;
              }
              else {
                if (5 < bVar9 - 0x61) goto LAB_00108a93;
                uVar11 = bVar9 - 0x57;
              }
            }
            uVar10 = uVar10 * 0x10 + uVar11;
            if ((int)lVar8 == 3) break;
            bVar9 = *pbVar1;
            lVar8 = lVar8 + 1;
          }
          if ((uVar10 & 0xfffffc00) != 0xdc00) {
            return false;
          }
          uVar12 = uVar12 * 0x400 + (uVar10 & 0x3ff) + 0xfca10000;
          goto LAB_00108ac3;
        }
      }
LAB_00108a93:
      in->consumed_ = false;
    }
  }
  return false;
}

Assistant:

inline bool _parse_codepoint(String &out, input<Iter> &in) {
  int uni_ch;
  if ((uni_ch = _parse_quadhex(in)) == -1) {
    return false;
  }
  if (0xd800 <= uni_ch && uni_ch <= 0xdfff) {
    if (0xdc00 <= uni_ch) {
      // a second 16-bit of a surrogate pair appeared
      return false;
    }
    // first 16-bit of surrogate pair, get the next one
    if (in.getc() != '\\' || in.getc() != 'u') {
      in.ungetc();
      return false;
    }
    int second = _parse_quadhex(in);
    if (!(0xdc00 <= second && second <= 0xdfff)) {
      return false;
    }
    uni_ch = ((uni_ch - 0xd800) << 10) | ((second - 0xdc00) & 0x3ff);
    uni_ch += 0x10000;
  }
  if (uni_ch < 0x80) {
    out.push_back(static_cast<char>(uni_ch));
  } else {
    if (uni_ch < 0x800) {
      out.push_back(static_cast<char>(0xc0 | (uni_ch >> 6)));
    } else {
      if (uni_ch < 0x10000) {
        out.push_back(static_cast<char>(0xe0 | (uni_ch >> 12)));
      } else {
        out.push_back(static_cast<char>(0xf0 | (uni_ch >> 18)));
        out.push_back(static_cast<char>(0x80 | ((uni_ch >> 12) & 0x3f)));
      }
      out.push_back(static_cast<char>(0x80 | ((uni_ch >> 6) & 0x3f)));
    }
    out.push_back(static_cast<char>(0x80 | (uni_ch & 0x3f)));
  }
  return true;
}